

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O3

void __thiscall Plane::Init(Plane *this,float *verts,int numVerts)

{
  float *pfVar1;
  long lVar2;
  uint uVar3;
  float *pfVar4;
  float *v [3];
  
  if (2 < numVerts) {
    v[0] = verts;
    pfVar4 = verts + 3;
    lVar2 = (ulong)(uint)numVerts - 1;
    uVar3 = 1;
    do {
      pfVar1 = v[uVar3 - 1];
      if (((0.001 < ABS(*pfVar4 - *pfVar1)) || (0.001 < ABS(pfVar4[1] - pfVar1[1]))) ||
         (0.001 < ABS(pfVar4[2] - pfVar1[2]))) {
        v[uVar3] = pfVar4;
        uVar3 = uVar3 + 1;
        if (uVar3 == 3) {
          Init(this,verts,v[1],v[2]);
          return;
        }
      }
      pfVar4 = pfVar4 + 3;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void Plane::Init(float *verts, int numVerts)
{
   float *v[3], *t;
   int i, curVert;

   if (numVerts < 3) return;

   curVert = 1;
   v[0] = verts + 0;
   for (i = 1; i < numVerts; i++)
   {
      t = verts + (i * 3);
      if (FNOTEQUAL(t[0], v[curVert - 1][0]) || FNOTEQUAL(t[1], v[curVert - 1][1]) || FNOTEQUAL(t[2], v[curVert - 1][2]))
      {
         v[curVert] = t;
         curVert++;
      }
      if (curVert == 3) break;
   }

   if (curVert != 3)
   {
      // degenerate triangle, no valid normal
      return;
   }

   Init(v[0], v[1], v[2]);
}